

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

size_t utilMin(size_t n,...)

{
  long lVar1;
  long in_RDI;
  size_t current;
  va_list marker;
  size_t min;
  ulong *local_100;
  ulong local_e8 [24];
  uint local_28;
  ulong *local_20;
  ulong local_10;
  long local_8;
  
  local_10 = 0xffffffffffffffff;
  local_20 = (ulong *)&stack0x00000008;
  local_28 = 8;
  local_8 = in_RDI;
  while (lVar1 = local_8 + -1, local_8 != 0) {
    if (local_28 < 0x29) {
      local_100 = (ulong *)((long)local_e8 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_100 = local_20;
      local_20 = local_20 + 1;
    }
    local_8 = lVar1;
    if (*local_100 < local_10) {
      local_10 = *local_100;
    }
  }
  return local_10;
}

Assistant:

size_t utilMin(size_t n, ...)
{
	size_t min = SIZE_MAX;
	va_list marker;
	ASSERT(n > 0);
	va_start(marker, n);
	while (n--)
	{
		size_t current = va_arg(marker, size_t);
		if (current < min)
			min = current;
	}
	va_end(marker);
	return min;
}